

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Bdd __thiscall
sylvan::Bdd::Permute
          (Bdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *from,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *to)

{
  uint32_t key;
  size_type sVar1;
  const_reference pvVar2;
  BDD from_00;
  BDDVAR in_ECX;
  undefined4 in_register_0000000c;
  Bdd local_40;
  int local_34;
  BddMap BStack_30;
  int i;
  BddMap map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *to_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *from_local;
  Bdd *this_local;
  
  map.bdd = CONCAT44(in_register_0000000c,in_ECX);
  BddMap::BddMap(&stack0xffffffffffffffd0);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(to);
  local_34 = (int)sVar1;
  while (local_34 = local_34 + -1, -1 < local_34) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](to,(long)local_34)
    ;
    key = *pvVar2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)map.bdd,
                        (long)local_34);
    bddVar(&local_40,*pvVar2);
    BddMap::put(&stack0xffffffffffffffd0,key,&local_40);
    ~Bdd(&local_40);
  }
  from_00 = sylvan_compose_RUN(*(sylvan **)from,BStack_30.bdd,0,in_ECX);
  Bdd(this,from_00);
  BddMap::~BddMap(&stack0xffffffffffffffd0);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::Permute(const std::vector<uint32_t>& from, const std::vector<uint32_t>& to) const
{
    /* Create a map */
    BddMap map;
    for (int i=from.size()-1; i>=0; i--) {
        map.put(from[i], Bdd::bddVar(to[i]));
    }

    return sylvan_compose(bdd, map.bdd);
}